

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorShower::retranslateStrings(QColorShower *this)

{
  QLabel *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->lblHue;
  QColorDialog::tr((QString *)&local_40,"Hu&e:",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->lblSat;
  QColorDialog::tr((QString *)&local_40,"&Sat:",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->lblVal;
  QColorDialog::tr((QString *)&local_40,"&Val:",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->lblRed;
  QColorDialog::tr((QString *)&local_40,"&Red:",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->lblGreen;
  QColorDialog::tr((QString *)&local_40,"&Green:",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->lblBlue;
  QColorDialog::tr((QString *)&local_40,"Bl&ue:",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->alphaLab;
  QColorDialog::tr((QString *)&local_40,"A&lpha channel:",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->lblHtml;
  QColorDialog::tr((QString *)&local_40,"&HTML:",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::retranslateStrings()
{
    lblHue->setText(QColorDialog::tr("Hu&e:"));
    lblSat->setText(QColorDialog::tr("&Sat:"));
    lblVal->setText(QColorDialog::tr("&Val:"));
    lblRed->setText(QColorDialog::tr("&Red:"));
    lblGreen->setText(QColorDialog::tr("&Green:"));
    lblBlue->setText(QColorDialog::tr("Bl&ue:"));
    alphaLab->setText(QColorDialog::tr("A&lpha channel:"));
    lblHtml->setText(QColorDialog::tr("&HTML:"));
}